

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O2

size_t bitset_extract_setbits(uint64_t *words,size_t length,uint32_t *out,uint32_t base)

{
  long lVar1;
  uint32_t *puVar2;
  size_t i;
  int iVar3;
  uint64_t uVar4;
  
  iVar3 = 0;
  for (i = 0; i != length; i = i + 1) {
    puVar2 = out + iVar3;
    for (uVar4 = words[i]; uVar4 != 0; uVar4 = uVar4 & uVar4 - 1) {
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      *puVar2 = (int)lVar1 + base;
      iVar3 = iVar3 + 1;
      puVar2 = puVar2 + 1;
    }
    base = base + 0x40;
  }
  return (long)iVar3;
}

Assistant:

size_t bitset_extract_setbits(const uint64_t *words, size_t length,
                              uint32_t *out, uint32_t base) {
    int outpos = 0;
    for (size_t i = 0; i < length; ++i) {
        uint64_t w = words[i];
        while (w != 0) {
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out + outpos, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            outpos++;
            w &= (w - 1);
        }
        base += 64;
    }
    return outpos;
}